

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strip.cpp
# Opt level: O1

void __thiscall wasm::Strip::run(Strip *this,Module *module)

{
  pointer *ppcVar1;
  size_type *psVar2;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  __last;
  pointer puVar3;
  char *pcVar4;
  bool bVar5;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  _Var6;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar7;
  undefined1 local_90 [8];
  CustomSection temp;
  code *local_48;
  
  _Var6._M_current =
       (module->customSections).
       super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (module->customSections).
       super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ppcVar1 = &temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::function<bool_(wasm::CustomSection_&)>::function
            ((function<bool_(wasm::CustomSection_&)> *)ppcVar1,&this->decider);
  _Var6 = std::
          remove_if<__gnu_cxx::__normal_iterator<wasm::CustomSection*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>,std::function<bool(wasm::CustomSection&)>>
                    (_Var6,__last,(function<bool_(wasm::CustomSection_&)> *)ppcVar1);
  std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::_M_erase
            (&module->customSections,(iterator)_Var6._M_current,
             (module->customSections).
             super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_48 != (code *)0x0) {
    ppcVar1 = &temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (*local_48)((_Any_data *)ppcVar1,(_Any_data *)ppcVar1,__destroy_functor);
  }
  pcVar4 = BinaryConsts::CustomSections::Name;
  psVar2 = &temp.name._M_string_length;
  temp.name._M_dataplus._M_p = (pointer)0x0;
  temp.name._M_string_length._0_1_ = 0;
  temp.name.field_2._8_8_ = 0;
  temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_90 = (undefined1  [8])psVar2;
  strlen(BinaryConsts::CustomSections::Name);
  std::__cxx11::string::_M_replace((ulong)local_90,0,(char *)0x0,(ulong)pcVar4);
  if ((this->decider).super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar5 = (*(this->decider)._M_invoker)((_Any_data *)&this->decider,(CustomSection *)local_90);
    if (bVar5) {
      Module::clearDebugInfo(module);
      puVar3 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar7 = (module->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3; puVar7 = puVar7 + 1
          ) {
        Function::clearNames
                  ((puVar7->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        Function::clearDebugInfo
                  ((puVar7->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
    }
    if (temp.name.field_2._8_8_ != 0) {
      operator_delete((void *)temp.name.field_2._8_8_,
                      (long)temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish - temp.name.field_2._8_8_);
    }
    if (local_90 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_90,
                      CONCAT71(temp.name._M_string_length._1_7_,
                               (undefined1)temp.name._M_string_length) + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void run(Module* module) override {
    // Remove name and debug sections.
    auto& sections = module->customSections;
    sections.erase(std::remove_if(sections.begin(), sections.end(), decider),
                   sections.end());
    // If we're cleaning up debug info, clear on the function and module too.
    CustomSection temp;
    temp.name = BinaryConsts::CustomSections::Name;
    if (decider(temp)) {
      module->clearDebugInfo();
      for (auto& func : module->functions) {
        func->clearNames();
        func->clearDebugInfo();
      }
    }
  }